

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleline.h
# Opt level: O2

void __thiscall bandit::reporter::singleline::test_run_complete(singleline *this)

{
  std::endl<char,std::char_traits<char>>((this->super_colored_base).stm_);
  summary::write((int)(this->super_colored_base).stm_,
                 (void *)(ulong)(uint)(this->super_colored_base).super_progress_base.specs_run_,
                 (ulong)(uint)(this->super_colored_base).super_progress_base.specs_failed_);
  return;
}

Assistant:

void test_run_complete() override {
        progress_base::test_run_complete();

        stm_ << std::endl;

        summary::write(stm_, specs_run_, specs_failed_, specs_succeeded_, specs_skipped_, failures_,
            test_run_errors_, colorizer_);
      }